

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

void __thiscall deci::ast_identifier_t::ast_identifier_t(ast_identifier_t *this,string *value)

{
  (this->super_ast_item_t).parent = (ast_item_t *)0x0;
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011d480;
  std::__cxx11::string::string((string *)&this->value,(string *)value);
  return;
}

Assistant:

ast_identifier_t::ast_identifier_t(const std::string& value):value(value) {

  }